

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<solitaire::geometry::Position> *
testing::internal::ActionResultHolder<solitaire::geometry::Position>::
PerformAction<solitaire::geometry::Position(unsigned_int)>
          (Action<solitaire::geometry::Position_(unsigned_int)> *action,ArgumentTuple *args)

{
  ActionResultHolder<solitaire::geometry::Position> *pAVar1;
  Result RVar2;
  _Head_base<0UL,_unsigned_int,_false> local_1c;
  
  pAVar1 = (ActionResultHolder<solitaire::geometry::Position> *)operator_new(0x10);
  local_1c._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_int>).super__Head_base<0UL,_unsigned_int,_false>.
       _M_head_impl;
  RVar2 = Action<solitaire::geometry::Position_(unsigned_int)>::Perform
                    (action,(ArgumentTuple *)&local_1c);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002ea1d0;
  (pAVar1->result_).value_ = RVar2;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }